

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-set-form-values.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  QPDFAnnotationObjectHelper QVar3;
  bool bVar4;
  undefined1 in_stack_fffffffffffffda8 [40];
  char *in_stack_fffffffffffffdd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffdd8;
  exception *e;
  QPDFWriter w;
  allocator<char> local_1e9;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  QPDFAnnotationObjectHelper local_1a8;
  undefined1 local_170 [8];
  QPDFFormFieldObjectHelper ffh;
  QPDFAnnotationObjectHelper *annot;
  iterator __end2;
  iterator __begin2;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_e8 [24];
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_d0;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2;
  QPDFPageObjectHelper *page;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_b8;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_88 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_70;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  QPDFAcroFormDocumentHelper afdh;
  QPDF local_38 [8];
  QPDF qpdf;
  char *value;
  char *outfilename;
  char *infilename;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc != 4) {
    usage();
  }
  pcVar1 = argv[1];
  pcVar2 = argv[2];
  _qpdf = argv[3];
  QPDF::QPDF(local_38);
  QPDF::processFile((char *)local_38,pcVar1);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            ((QPDFAcroFormDocumentHelper *)&__range1,local_38);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,local_38);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_70 = local_88;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_70)
  ;
  local_b8._M_current =
       (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_70);
  while (bVar4 = __gnu_cxx::operator!=(&__end1,&local_b8), bVar4) {
    __range2 = (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
               __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end1);
    QPDFPageObjectHelper::QPDFPageObjectHelper
              ((QPDFPageObjectHelper *)&__begin2,(QPDFPageObjectHelper *)__range2);
    QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage((QPDFPageObjectHelper *)local_e8);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2);
    local_d0 = local_e8;
    __end2 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
             begin(local_d0);
    annot = (QPDFAnnotationObjectHelper *)
            std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
            end(local_d0);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                       *)&annot), bVar4) {
      ffh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
           ::operator*(&__end2);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                (&local_1a8,
                 (QPDFAnnotationObjectHelper *)
                 ffh.m.
                 super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      QVar3.m.super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)in_stack_fffffffffffffdd0;
      QVar3.super_QPDFObjectHelper = (QPDFObjectHelper)in_stack_fffffffffffffda8[0];
      QVar3._1_8_ = in_stack_fffffffffffffda8._1_8_;
      QVar3._9_8_ = in_stack_fffffffffffffda8._9_8_;
      QVar3._17_8_ = in_stack_fffffffffffffda8._17_8_;
      QVar3._25_8_ = in_stack_fffffffffffffda8._25_8_;
      QVar3._33_7_ = in_stack_fffffffffffffda8._33_7_;
      QVar3.m.super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = in_stack_fffffffffffffdd8._M_pi;
      QPDFAcroFormDocumentHelper::getFieldForAnnotation(QVar3);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_1a8);
      QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_();
      bVar4 = std::operator==(&local_1c8,"/Tx");
      std::__cxx11::string::~string((string *)&local_1c8);
      if (bVar4) {
        in_stack_fffffffffffffdd8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_1e9
        ;
        in_stack_fffffffffffffdd0 = _qpdf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1e8,in_stack_fffffffffffffdd0,
                   (allocator<char> *)in_stack_fffffffffffffdd8._M_pi);
        QPDFFormFieldObjectHelper::setV((string *)local_170,SUB81(local_1e8,0));
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        QPDFFormFieldObjectHelper::generateAppearance((QPDFAnnotationObjectHelper *)local_170);
      }
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_170);
      __gnu_cxx::
      __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
      ::operator++(&__end2);
    }
    page._4_4_ = 4;
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
              (local_e8);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  page._4_4_ = 2;
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_88);
  QPDFWriter::QPDFWriter((QPDFWriter *)&e,local_38,pcVar2);
  QPDFWriter::setStaticID(false);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter((QPDFWriter *)&e);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)&__range1);
  QPDF::~QPDF(local_38);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 4) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* value = argv[3];

    // This is a contrived example that just goes through a file page by page and sets the value of
    // any text fields it finds to a fixed value as given on the command line. The purpose here is
    // to illustrate use of the helper classes around interactive forms.

    try {
        QPDF qpdf;
        qpdf.processFile(infilename);

        // We will iterate through form fields by starting at the page level and looking at each
        // field for each page. We could also call QPDFAcroFormDocumentHelper::getFormFields to
        // iterate at the field level, but doing it as below illustrates how we can map from
        // annotations to fields.

        QPDFAcroFormDocumentHelper afdh(qpdf);
        for (auto const& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all widget annotations for each page. Widget annotations are the ones that
            // contain the details of what's in a form field.
            for (auto& annot: afdh.getWidgetAnnotationsForPage(page)) {
                // For each annotation, find its associated field. If it's a text field, set its
                // value.
                QPDFFormFieldObjectHelper ffh = afdh.getFieldForAnnotation(annot);
                if (ffh.getFieldType() == "/Tx") {
                    // Set the value. Passing false as the second parameter prevents qpdf from
                    // setting /NeedAppearances to true (but will not turn it off if it's already
                    // on), so we call generateAppearance after setting the value. You may or may
                    // not want to do this depending on whether the appearance streams generated by
                    // qpdf are good enough for your purposes. For additional details, please see
                    // comments in QPDFFormFieldObjectHelper.hh for this method.
                    ffh.setV(value, false);
                    ffh.generateAppearance(annot);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        w.setStaticID(true); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}